

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::RowGroup::printTo(RowGroup *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  long *in_stack_00000008;
  vector<duckdb_parquet::ColumnChunk,_true> *in_stack_00000048;
  string local_118 [39];
  byte local_f1;
  string local_f0 [39];
  byte local_c9;
  string local_c8 [39];
  byte local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"RowGroup(");
  poVar1 = std::operator<<(local_10,"columns=");
  duckdb_apache::thrift::to_string<duckdb_parquet::ColumnChunk>(in_stack_00000048);
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"total_byte_size=");
  duckdb_apache::thrift::to_string<long>(in_stack_00000008);
  std::operator<<(poVar1,local_60);
  std::__cxx11::string::~string(local_60);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"num_rows=");
  duckdb_apache::thrift::to_string<long>(in_stack_00000008);
  std::operator<<(poVar1,local_80);
  std::__cxx11::string::~string(local_80);
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"sorting_columns=");
  poVar1 = local_10;
  local_a1 = 0;
  if ((*(byte *)(in_RDI + 0x5a) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::SortingColumn>
              ((vector<duckdb_parquet::SortingColumn,_true> *)in_stack_00000048);
    local_a1 = 1;
    std::operator<<(poVar1,local_a0);
  }
  if ((local_a1 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"file_offset=");
  poVar1 = local_10;
  local_c9 = 0;
  if ((*(byte *)(in_RDI + 0x5a) >> 1 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(in_stack_00000008);
    local_c9 = 1;
    std::operator<<(poVar1,local_c8);
  }
  if ((local_c9 & 1) != 0) {
    std::__cxx11::string::~string(local_c8);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"total_compressed_size=");
  poVar1 = local_10;
  local_f1 = 0;
  if ((*(byte *)(in_RDI + 0x5a) >> 2 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>(in_stack_00000008);
    local_f1 = 1;
    std::operator<<(poVar1,local_f0);
  }
  if ((local_f1 & 1) != 0) {
    std::__cxx11::string::~string(local_f0);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"ordinal=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0x5a) >> 3 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<short>((short *)in_stack_00000008);
    std::operator<<(poVar1,local_118);
    std::__cxx11::string::~string(local_118);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void RowGroup::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "RowGroup(";
  out << "columns=" << to_string(columns);
  out << ", " << "total_byte_size=" << to_string(total_byte_size);
  out << ", " << "num_rows=" << to_string(num_rows);
  out << ", " << "sorting_columns="; (__isset.sorting_columns ? (out << to_string(sorting_columns)) : (out << "<null>"));
  out << ", " << "file_offset="; (__isset.file_offset ? (out << to_string(file_offset)) : (out << "<null>"));
  out << ", " << "total_compressed_size="; (__isset.total_compressed_size ? (out << to_string(total_compressed_size)) : (out << "<null>"));
  out << ", " << "ordinal="; (__isset.ordinal ? (out << to_string(ordinal)) : (out << "<null>"));
  out << ")";
}